

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)14,(moira::Mode)8,(moira::Size)2>(Moira *this,u16 op)

{
  u32 addr;
  u32 uVar1;
  u32 uVar2;
  undefined8 in_RAX;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  addr = computeEA<(moira::Mode)8,(moira::Size)2,0ul>(this,op & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,&local_21);
  if (local_21 == false) {
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    uVar1 = shift<(moira::Instr)14,(moira::Size)2>(this,1,(ulong)uVar1);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,uVar1);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}